

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

void syms_init(void)

{
  size_t unaff_retaddr;
  
  syms_free();
  root = (symtbl_t *)mmalloc(unaff_retaddr);
  root->scope_id = 0;
  root->num_syms = 0;
  root->num_children = 0;
  root->parent = (symtbl_t *)0x0;
  root->children = (symtbl_t **)0x0;
  root->syms = (sym_t **)0x0;
  scope_id = 0;
  cur_scope_id = 0;
  scope = root;
  return;
}

Assistant:

void syms_init()
{
    syms_free();
    root = (symtbl_t*)mmalloc(sizeof(symtbl_t));
    root->scope_id = 0;
    root->num_syms = 0;
    root->num_children = 0;
    root->parent = NULL;
    root->children = NULL;
    root->syms = NULL;

    scope_id = 0;
    cur_scope_id = 0;

    scope = root;
}